

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.h
# Opt level: O2

void __thiscall QStyleOptionTab::QStyleOptionTab(QStyleOptionTab *this,QStyleOptionTab *other)

{
  QStyleOption::QStyleOption(&this->super_QStyleOption,1,3);
  (this->text).d.d = (Data *)0x0;
  (this->text).d.ptr = (char16_t *)0x0;
  (this->text).d.size = 0;
  QIcon::QIcon(&this->icon);
  this->cornerWidgets = (QFlagsStorageHelper<QStyleOptionTab::CornerWidget,_4>)0x0;
  (this->iconSize).wd = -1;
  (this->iconSize).ht.m_i = -1;
  (this->leftButtonSize).wd.m_i = -1;
  (this->leftButtonSize).ht.m_i = -1;
  (this->rightButtonSize).wd.m_i = -1;
  (this->rightButtonSize).ht.m_i = -1;
  this->features = (QFlagsStorageHelper<QStyleOptionTab::TabFeature,_4>)0x0;
  this->tabIndex = -1;
  operator=(this,other);
  return;
}

Assistant:

QStyleOptionTab(const QStyleOptionTab &other) : QStyleOption(Version, Type) { *this = other; }